

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  undefined1 *puVar3;
  ulong uVar4;
  pointer pcVar5;
  path *ppVar6;
  int iVar7;
  error_category *peVar8;
  int *piVar9;
  size_type sVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  path *result_2;
  char cVar13;
  path result_1;
  path base;
  path result;
  path local_108;
  path local_e8;
  path local_c8;
  path local_a8;
  path local_88;
  path local_68;
  path local_48;
  
  peVar8 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar8;
  current_path(&local_e8,ec);
  if (ec->_M_value != 0) {
    piVar9 = __errno_location();
    ec->_M_value = *piVar9;
    ec->_M_cat = peVar8;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    goto LAB_0011dcaa;
  }
  uVar11 = (p->_path)._M_string_length;
  if (uVar11 == 0) {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_e8._path._M_dataplus._M_p,
               local_e8._path._M_dataplus._M_p + local_e8._path._M_string_length);
    path::operator/=(__return_storage_ptr__,p);
    goto LAB_0011dcaa;
  }
  cVar13 = (char)p;
  if ((((uVar11 < 3) || (pcVar2 = (p->_path)._M_dataplus._M_p, *pcVar2 != '/')) ||
      (pcVar2[1] != '/')) || (pcVar2[2] == 0x2f)) {
LAB_0011dbbc:
    if ((((p->_path)._M_string_length < 3) || (pcVar2 = (p->_path)._M_dataplus._M_p, *pcVar2 != '/')
        ) || ((pcVar2[1] != '/' || (pcVar2[2] == 0x2f)))) {
LAB_0011dc01:
      uVar11 = 0;
    }
    else {
      iVar7 = isprint((int)pcVar2[2]);
      if (iVar7 == 0) goto LAB_0011dc01;
      uVar11 = std::__cxx11::string::find(cVar13,0x2f);
      if (uVar11 == 0xffffffffffffffff) {
        uVar11 = (p->_path)._M_string_length;
      }
    }
    if (((p->_path)._M_string_length <= uVar11) || ((p->_path)._M_dataplus._M_p[uVar11] != '/')) {
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_e8._path._M_dataplus._M_p,
                 local_e8._path._M_dataplus._M_p + local_e8._path._M_string_length);
      path::operator/=(__return_storage_ptr__,p);
      goto LAB_0011dcaa;
    }
    path::root_name(&local_108,&local_e8);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_108._path._M_dataplus._M_p,
               local_108._path._M_dataplus._M_p + local_108._path._M_string_length);
    path::operator/=(__return_storage_ptr__,p);
    ppVar6 = &local_108;
  }
  else {
    iVar7 = isprint((int)pcVar2[2]);
    if (iVar7 == 0) goto LAB_0011dbbc;
    sVar10 = std::__cxx11::string::find(cVar13,0x2f);
    if (sVar10 == 0xffffffffffffffff) {
      sVar10 = (p->_path)._M_string_length;
    }
    if (sVar10 == 0) goto LAB_0011dbbc;
    if (((((p->_path)._M_string_length < 3) ||
         (pcVar2 = (p->_path)._M_dataplus._M_p, *pcVar2 != '/')) || (pcVar2[1] != '/')) ||
       (pcVar2[2] == 0x2f)) {
LAB_0011dcd1:
      uVar11 = 0;
    }
    else {
      iVar7 = isprint((int)pcVar2[2]);
      if (iVar7 == 0) goto LAB_0011dcd1;
      uVar11 = std::__cxx11::string::find(cVar13,0x2f);
      if (uVar11 == 0xffffffffffffffff) {
        uVar11 = (p->_path)._M_string_length;
      }
    }
    uVar4 = (p->_path)._M_string_length;
    if ((uVar11 < uVar4) && ((p->_path)._M_dataplus._M_p[uVar11] == '/')) {
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      pcVar5 = (p->_path)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar5,pcVar5 + uVar4);
      goto LAB_0011dcaa;
    }
    path::root_name(&local_a8,p);
    path::root_directory(&local_48,&local_e8);
    paVar12 = &local_c8._path.field_2;
    local_c8._path._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_a8._path._M_dataplus._M_p,
               local_a8._path._M_dataplus._M_p + local_a8._path._M_string_length);
    path::operator/=(&local_c8,&local_48);
    path::relative_path(&local_68,&local_e8);
    paVar1 = &local_108._path.field_2;
    local_108._path._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_c8._path._M_dataplus._M_p,
               local_c8._path._M_dataplus._M_p + local_c8._path._M_string_length);
    path::operator/=(&local_108,&local_68);
    path::relative_path(&local_88,p);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_108._path._M_dataplus._M_p,
               local_108._path._M_dataplus._M_p + local_108._path._M_string_length);
    path::operator/=(__return_storage_ptr__,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._path._M_dataplus._M_p != &local_88._path.field_2) {
      operator_delete(local_88._path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._path._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._path._M_dataplus._M_p != &local_68._path.field_2) {
      operator_delete(local_68._path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._path._M_dataplus._M_p != paVar12) {
      operator_delete(local_c8._path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._path._M_dataplus._M_p != &local_48._path.field_2) {
      operator_delete(local_48._path._M_dataplus._M_p);
    }
    ppVar6 = &local_a8;
  }
  paVar12 = &(ppVar6->_path).field_2;
  puVar3 = *(undefined1 **)(paVar12->_M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 != paVar12) {
    operator_delete(puVar3);
  }
LAB_0011dcaa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._path._M_dataplus._M_p != &local_e8._path.field_2) {
    operator_delete(local_e8._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(GHC_NATIVEWP(p), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(GHC_NATIVEWP(p), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}